

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O2

void __thiscall
pstack::Procman::ProcessLocation::ProcessLocation(ProcessLocation *this,Process *proc,Addr address_)

{
  tuple<unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*> local_88;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 auStack_48 [8];
  sptr dwarf;
  
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->codeloc).super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Process::findSegment(&local_88,proc,address_);
  if (local_88.
      super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
      .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
      super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>._M_head_impl.
      super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    auStack_48 = (undefined1  [8])0x0;
    dwarf.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)
               &local_88.
                super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                .super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>.
                super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>);
    Process::getDwarf((Process *)auStack_48,(sptr *)proc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    if (auStack_48 != (undefined1  [8])0x0) {
      std::
      make_shared<pstack::Procman::CodeLocation,std::shared_ptr<pstack::Dwarf::Info>&,Elf64_Phdr_const*&,unsigned_long>
                ((shared_ptr<pstack::Dwarf::Info> *)&local_58,(Elf64_Phdr **)auStack_48,
                 (unsigned_long *)&local_88);
      goto LAB_0013ff6f;
    }
  }
  local_58._M_ptr = (element_type *)0x0;
  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0013ff6f:
  std::__shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->codeloc).
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>,
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  this->location_ = address_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dwarf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_88.
                     super__Tuple_impl<0UL,_unsigned_long,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                     .
                     super__Tuple_impl<1UL,_std::shared_ptr<pstack::Elf::Object>,_const_Elf64_Phdr_*>
                     .super__Head_base<1UL,_std::shared_ptr<pstack::Elf::Object>,_false>.
                     _M_head_impl.
                     super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> + 8));
  return;
}

Assistant:

ProcessLocation::ProcessLocation(Process &proc, Elf::Addr address_) {
    auto [ elfReloc, elf, phdr ] = proc.findSegment(address_);
    auto dwarf = elf ? proc.getDwarf(elf) : nullptr;
    if (dwarf) {
        codeloc = std::make_shared<CodeLocation>(dwarf, phdr, address_ - elfReloc);
    } else {
        codeloc = nullptr;
    }
    location_ = address_;
}